

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LibraryIncludeStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncludeStatementSyntax,slang::syntax::LibraryIncludeStatementSyntax_const&>
          (BumpAllocator *this,LibraryIncludeStatementSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  FilePathSpecSyntax *pFVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  LibraryIncludeStatementSyntax *pLVar13;
  
  pLVar13 = (LibraryIncludeStatementSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((LibraryIncludeStatementSyntax *)this->endPtr < pLVar13 + 1) {
    pLVar13 = (LibraryIncludeStatementSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pLVar13 + 1);
  }
  (pLVar13->super_MemberSyntax).super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_MemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).super_SyntaxNode.parent;
  (pLVar13->super_MemberSyntax).super_SyntaxNode.kind =
       (args->super_MemberSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pLVar13->super_MemberSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pLVar13->super_MemberSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = *(undefined4 *)
           &(args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)
   &(pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5
  ;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_MemberSyntax).attributes.super_SyntaxListBase.childCount;
  sVar2 = (args->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pLVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  (pLVar13->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar2;
  (pLVar13->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dc3a8;
  uVar6 = (args->include).field_0x2;
  NVar7.raw = (args->include).numFlags.raw;
  uVar8 = (args->include).rawLen;
  pIVar3 = (args->include).info;
  pFVar4 = (args->filePath).ptr;
  TVar9 = (args->semi).kind;
  uVar10 = (args->semi).field_0x2;
  NVar11.raw = (args->semi).numFlags.raw;
  uVar12 = (args->semi).rawLen;
  (pLVar13->include).kind = (args->include).kind;
  (pLVar13->include).field_0x2 = uVar6;
  (pLVar13->include).numFlags = (NumericTokenFlags)NVar7.raw;
  (pLVar13->include).rawLen = uVar8;
  (pLVar13->include).info = pIVar3;
  (pLVar13->filePath).ptr = pFVar4;
  (pLVar13->semi).kind = TVar9;
  (pLVar13->semi).field_0x2 = uVar10;
  (pLVar13->semi).numFlags = (NumericTokenFlags)NVar11.raw;
  (pLVar13->semi).rawLen = uVar12;
  (pLVar13->semi).info = (args->semi).info;
  return pLVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }